

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O3

void inputParticle(Particle *particle,int filenum,char *seq)

{
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ifstream inFile;
  char buffer [256];
  undefined1 auStack_368 [12];
  int local_35c;
  char *local_358;
  char *local_350;
  ulong local_348;
  double local_340 [4];
  byte abStack_320 [488];
  undefined1 local_138 [264];
  
  std::ifstream::ifstream(local_340);
  pcVar2 = catStrStr(inputAddress,"particleO_");
  local_35c = filenum + 1;
  pcVar2 = catStrIntStr(pcVar2,local_35c,".txt");
  openFile(pcVar2,(ifstream *)local_340);
  lVar7 = *(long *)((long)local_340[0] + -0x18);
  iVar9 = 0;
  local_358 = pcVar2;
  if ((abStack_320[lVar7] & 2) == 0) {
    iVar9 = 0;
    do {
      std::ios::widen((char)auStack_368 + (char)lVar7 + '(');
      std::istream::getline((char *)local_340,(long)local_138,'\0');
      iVar9 = iVar9 + 1;
      lVar7 = *(long *)((long)local_340[0] + -0x18);
    } while ((abStack_320[lVar7] & 2) == 0);
  }
  iVar6 = iVar9 + -1;
  iVar1 = iVar9 + 2;
  if (-1 < iVar6) {
    iVar1 = iVar6;
  }
  particle->numAA = iVar1 >> 2;
  particle->numAtom = (iVar1 >> 2) * 3;
  std::ifstream::close();
  openFile(local_358,(ifstream *)local_340);
  pdVar3 = (double *)operator_new__(-(ulong)(iVar9 == 0) | (long)(iVar6 * 3) << 3);
  particle->addO_origin = pdVar3;
  iVar9 = particle->numAA;
  iVar6 = iVar9 * 9;
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar4 = (long)iVar6 * 8;
  }
  pdVar3 = (double *)operator_new__(uVar4);
  particle->origin = pdVar3;
  local_348 = (ulong)(uint)filenum;
  if (iVar9 < 1) {
    uVar4 = (ulong)(uint)(iVar9 * 0xc);
  }
  else {
    lVar7 = 0;
    uVar8 = 0;
    iVar9 = 0;
    local_350 = seq;
    do {
      std::istream::_M_extract<double>(local_340);
      if ((uint)((int)uVar8 + (int)((uVar8 & 0xffffffff) / 0xc) * -0xc) < 9) {
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + 1;
        particle->origin[lVar5] = *(double *)((long)particle->addO_origin + lVar7);
      }
      uVar8 = uVar8 + 1;
      iVar6 = particle->numAA;
      uVar4 = (long)iVar6 * 0xc;
      lVar7 = lVar7 + 8;
    } while (SBORROW8(uVar8,uVar4) != (long)(uVar8 + (long)iVar6 * -0xc) < 0);
    iVar6 = iVar6 * 9;
    seq = local_350;
  }
  particle->sizeOfAddO_origin = (int)uVar4;
  particle->sizeOfOrigin = iVar6;
  std::ifstream::close();
  operator_delete(local_358);
  pcVar2 = catStrStr(inputAddress,"phi");
  pcVar2 = catStrIntStr(pcVar2,local_35c,".txt");
  openFile(pcVar2,(ifstream *)local_340);
  iVar9 = particle->numAA;
  uVar4 = 0xffffffffffffffff;
  if (0 < (long)iVar9) {
    uVar4 = (long)iVar9 * 0x18 - 0x18;
  }
  pdVar3 = (double *)operator_new__(uVar4);
  particle->Position = pdVar3;
  if (1 < iVar9) {
    lVar7 = 0x10;
    lVar5 = 0;
    do {
      std::istream::_M_extract<double>(local_340);
      *(undefined8 *)((long)particle->Position + lVar7 + -8) = 0x4066800000000000;
      std::istream::_M_extract<double>(local_340);
      lVar5 = lVar5 + 3;
      lVar7 = lVar7 + 0x18;
    } while (lVar5 < (long)particle->numAA * 3 + -5);
  }
  std::ifstream::close();
  particle->sizeOfPosition = particle->numAA * 3 + -3;
  pdVar3 = (double *)operator_new__(8);
  particle->Cost = pdVar3;
  particle->index = (int)local_348;
  particle->seq = seq;
  std::ifstream::~ifstream(local_340);
  return;
}

Assistant:

void inputParticle(Particle &particle, int filenum, char *seq){
    ifstream inFile;
    char *fileAddress;
    char *filename;
    fileAddress = catStrStr(inputAddress, "particleO_");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    char buffer[256];
    // get the number of lines of the input file
    int cntLines = 0;
    while (! inFile.eof()) { inFile.getline(buffer, 256); cntLines++; }
    cntLines--;
    particle.numAA = cntLines/4;                                            // the number of AA
    particle.numAtom = particle.numAA *3;                          // the number of atoms ( not add O)
    inFile.close();                                                                         //get how many lines the input has

    // read the file to get the coordinaries
    openFile(filename, inFile);
    particle.addO_origin = new double[3*cntLines];                  //  the x,y,z of every atoms in the particle
    particle.origin = new double[particle.numAA*3 *3];          //  x,y,z, delete the number of the atom O
    int k=0;
    //  read the file by lines
    for (int j=0; j<12 * particle.numAA; j++){
        inFile >> particle.addO_origin[j];
        if (j % 12<9)
            particle.origin[k++] = particle.addO_origin[j];
    }
    particle.sizeOfAddO_origin = particle.numAA*4*3;
    particle.sizeOfOrigin = particle.numAA*3*3;                 //  the totally number of coordinaries
    inFile.close();
    delete filename;

    //  read the init angles
    fileAddress = catStrStr(inputAddress, "phi");
    filename = catStrIntStr(fileAddress, filenum+1, ".txt");
    openFile(filename, inFile);
    particle.Position = new double[3 * particle.numAA-3];     //   why so many 180  ?

    for (int j=0; j< 3*particle.numAA-5; j+=3){          // last : j=3*numAA-6; j+2=3*numAA-4
        inFile >> particle.Position[j] ;
        particle.Position[j+1] = 180;
        inFile >> particle.Position[j+2] ;
    }

    inFile.close();
    particle.sizeOfPosition = 3*particle.numAA-3;

    //  init particle.cost[]
    particle.Cost = new double [numObjective];

    particle.index = filenum;
    particle.seq = seq;

}